

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void icetGetFloatv(IceTEnum pname,IceTFloat *params)

{
  IceTEnum IVar1;
  IceTState pIVar2;
  char local_228 [8];
  char msg_1 [256];
  char msg [256];
  int i;
  IceTStateValue *value;
  IceTFloat *params_local;
  IceTEnum pname_local;
  
  pIVar2 = icetGetState();
  pIVar2 = pIVar2 + pname;
  IVar1 = pIVar2->type;
  if (IVar1 == 0) {
    sprintf(msg_1 + 0xf8,"No such parameter, 0x%x.",(ulong)pname);
    icetRaiseDiagnostic(msg_1 + 0xf8,0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x150);
  }
  else if (IVar1 == 0x8000) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] =
           (IceTFloat)(float)*(byte *)((long)pIVar2->data + (long)(int)msg._252_4_);
    }
  }
  else if (IVar1 == 0x8003) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] =
           (IceTFloat)(float)*(int *)((long)pIVar2->data + (long)(int)msg._252_4_ * 4);
    }
  }
  else if (IVar1 == 0x8004) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] = *(IceTFloat *)((long)pIVar2->data + (long)(int)msg._252_4_ * 4);
    }
  }
  else if (IVar1 == 0x8005) {
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    for (; (int)msg._252_4_ < pIVar2->num_entries; msg._252_4_ = msg._252_4_ + 1) {
      params[(int)msg._252_4_] =
           (IceTFloat)(float)*(double *)((long)pIVar2->data + (long)(int)msg._252_4_ * 8);
    }
  }
  else {
    sprintf(local_228,"Could not cast value for 0x%x.",(ulong)pname);
    icetRaiseDiagnostic(local_228,0xfffffffd,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x150);
  }
  return;
}

Assistant:

void icetGetFloatv(IceTEnum pname, IceTFloat *params)
{
    struct IceTStateValue *value = icetGetState() + pname;
    int i;
    stateCheck(pname, icetGetState());
    copyArray(IceTFloat, params, value->type, value->data, value->num_entries);
}